

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

QRegularExpressionMatchIterator __thiscall
QRegularExpression::globalMatchView
          (QRegularExpression *this,QStringView subjectView,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  QRegularExpressionMatchIteratorPrivate *dd;
  long in_FS_OFFSET;
  Int in_stack_00000008;
  QRegularExpressionMatch local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dd = (QRegularExpressionMatchIteratorPrivate *)operator_new(0x20);
  matchView((QRegularExpression *)&local_40,subjectView,offset,matchType,matchOptions);
  (dd->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QRegularExpressionMatch::QRegularExpressionMatch(&dd->next,&local_40);
  QRegularExpression(&dd->regularExpression,(QRegularExpression *)subjectView.m_size);
  dd->matchType =
       (MatchType)
       matchOptions.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
       super_QFlagsStorage<QRegularExpression::MatchOption>.i;
  (dd->matchOptions).super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
  super_QFlagsStorage<QRegularExpression::MatchOption>.i = in_stack_00000008;
  QRegularExpressionMatch::~QRegularExpressionMatch(&local_40);
  QRegularExpressionMatchIterator::QRegularExpressionMatchIterator
            ((QRegularExpressionMatchIterator *)this,dd);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatchIterator QRegularExpression::globalMatchView(QStringView subjectView,
                                                                    qsizetype offset,
                                                                    MatchType matchType,
                                                                    MatchOptions matchOptions) const
{
    QRegularExpressionMatchIteratorPrivate *priv =
            new QRegularExpressionMatchIteratorPrivate(*this,
                                                       matchType,
                                                       matchOptions,
                                                       matchView(subjectView, offset, matchType, matchOptions));

    return QRegularExpressionMatchIterator(*priv);
}